

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_sinks.h
# Opt level: O0

void __thiscall
spdlog::sinks::
daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::default_daily_file_name_calculator>::
~daily_file_sink(daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::default_daily_file_name_calculator>
                 *this)

{
  daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::default_daily_file_name_calculator>
  *this_local;
  
  ~daily_file_sink(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

class daily_file_sink SPDLOG_FINAL : public base_sink<Mutex>
{
public:
    // create daily file sink which rotates on given time
    daily_file_sink(filename_t base_filename, int rotation_hour, int rotation_minute)
        : _base_filename(std::move(base_filename))
        , _rotation_h(rotation_hour)
        , _rotation_m(rotation_minute)
    {
        if (rotation_hour < 0 || rotation_hour > 23 || rotation_minute < 0 || rotation_minute > 59)
        {
            throw spdlog_ex("daily_file_sink: Invalid rotation time in ctor");
        }
        _rotation_tp = _next_rotation_tp();
        _file_helper.open(FileNameCalc::calc_filename(_base_filename));
    }